

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

bool __thiscall
TypeEnum::getMatches
          (TypeEnum *this,uintb val,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valnames)

{
  const_iterator cVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  reference ppVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference pvVar7;
  uintb uVar8;
  _Self local_68;
  _Base_ptr local_60;
  ulong local_58;
  uintb maskedval;
  const_iterator cStack_48;
  int4 i;
  _Base_ptr local_40;
  byte local_35;
  int local_34;
  bool allmatch;
  const_iterator cStack_30;
  int4 count;
  const_iterator iter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *valnames_local;
  uintb val_local;
  TypeEnum *this_local;
  
  iter._M_node = (_Base_ptr)valnames;
  valnames_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)val;
  val_local = (uintb)this;
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&stack0xffffffffffffffd0);
  local_34 = 0;
  do {
    if (1 < local_34) {
      return false;
    }
    local_35 = 1;
    if (valnames_local ==
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      local_40 = (_Base_ptr)
                 std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this->namemap,(key_type_conflict *)&valnames_local);
      cStack_30 = (const_iterator)local_40;
      cStack_48 = std::
                  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(&this->namemap);
      bVar3 = std::operator!=(&stack0xffffffffffffffd0,&stack0xffffffffffffffb8);
      cVar1 = iter;
      if (bVar3) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&stack0xffffffffffffffd0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)cVar1._M_node,&ppVar4->second);
      }
      else {
        local_35 = 0;
      }
    }
    else {
      for (maskedval._4_4_ = 0; uVar5 = (ulong)maskedval._4_4_,
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->masklist),
          pvVar2 = valnames_local, uVar5 < sVar6; maskedval._4_4_ = maskedval._4_4_ + 1) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->masklist,(long)maskedval._4_4_);
        local_58 = (ulong)pvVar2 & *pvVar7;
        if (local_58 != 0) {
          local_60 = (_Base_ptr)
                     std::
                     map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&this->namemap,&local_58);
          cStack_30 = (const_iterator)local_60;
          local_68._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->namemap);
          bVar3 = std::operator!=(&stack0xffffffffffffffd0,&local_68);
          cVar1 = iter;
          if (!bVar3) {
            local_35 = 0;
            break;
          }
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&stack0xffffffffffffffd0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)cVar1._M_node,&ppVar4->second);
        }
      }
    }
    pvVar2 = valnames_local;
    if ((local_35 & 1) != 0) {
      return local_34 == 1;
    }
    uVar8 = calc_mask((this->super_TypeBase).super_Datatype.size);
    valnames_local =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((ulong)pvVar2 ^ uVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)iter._M_node);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool TypeEnum::getMatches(uintb val,vector<string> &valnames) const

{
  map<uintb,string>::const_iterator iter;
  int4 count;

  for(count=0;count<2;++count) {
    bool allmatch = true;
    if (val == 0) {	// Zero handled specially, it crosses all masks
      iter = namemap.find(val);
      if (iter != namemap.end())
	valnames.push_back( (*iter).second );
      else
	allmatch = false;
    }
    else {
      for(int4 i=0;i<masklist.size();++i) {
	uintb maskedval = val & masklist[i];
	if (maskedval == 0)	// No component of -val- in this mask
	  continue;		// print nothing
	iter = namemap.find(maskedval);
	if (iter != namemap.end())
	  valnames.push_back( (*iter).second );	// Found name for this component
	else {					// If no name for this component
	  allmatch = false;			// Give up on representation
	  break;				// Stop searching for other components
	}
      }
    }
    if (allmatch)			// If we have a complete representation
      return (count==1);		// Return whether we represented original value or complement
    val = val ^ calc_mask(size);	// Switch value we are trying to represent (to complement)
    valnames.clear();			// Clear out old attempt
  }
  return false;	// If we reach here, no representation was possible, -valnames- is empty
}